

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall FormatTest_OutputIterators_Test::TestBody(FormatTest_OutputIterators_Test *this)

{
  bool bVar1;
  _List_iterator<char> __beg;
  AssertHelper *this_00;
  AssertionResult gtest_ar_1;
  stringstream s;
  AssertionResult gtest_ar;
  list<char,_std::allocator<char>_> out;
  list<char,_std::allocator<char>_> *in_stack_fffffffffffffd28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd30;
  undefined7 in_stack_fffffffffffffd38;
  undefined1 in_stack_fffffffffffffd3f;
  char *in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd4c;
  int line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  _List_iterator<char> __end;
  Type type;
  back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> in_stack_fffffffffffffd78;
  int *in_stack_fffffffffffffd88;
  char (*in_stack_fffffffffffffd90) [3];
  ostream_iterator<char,_char,_std::char_traits<char>_> *in_stack_fffffffffffffd98;
  Message *in_stack_fffffffffffffda8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffdb0;
  ostream_iterator<char,_char,_std::char_traits<char>_> local_230;
  stringstream local_220 [16];
  ostream_type local_210 [399];
  undefined1 local_81 [17];
  string local_70 [32];
  AssertionResult local_50;
  list<char,_std::allocator<char>_> *local_40;
  undefined4 local_38;
  list<char,_std::allocator<char>_> *local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_20;
  
  pbVar2 = &local_20;
  std::__cxx11::list<char,_std::allocator<char>_>::list
            ((list<char,_std::allocator<char>_> *)0x181821);
  local_28 = (list<char,_std::allocator<char>_> *)
             std::back_inserter<std::__cxx11::list<char,std::allocator<char>>>
                       (in_stack_fffffffffffffd28);
  local_38 = 0x2a;
  __beg._M_node =
       (_List_node_base *)
       fmt::v5::
       format_to<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char[3],int>
                 (in_stack_fffffffffffffd78,(char (*) [3])local_28,(int *)pbVar2);
  pbVar2 = &local_20;
  local_40 = (list<char,_std::allocator<char>_> *)__beg._M_node;
  local_81._9_8_ = std::__cxx11::list<char,_std::allocator<char>_>::begin(in_stack_fffffffffffffd28)
  ;
  local_81._1_8_ = std::__cxx11::list<char,_std::allocator<char>_>::end(in_stack_fffffffffffffd28);
  __end._M_node = (_List_node_base *)local_81;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::_List_iterator<char>,void>
            (pbVar2,__beg,__end,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
  type = (Type)((ulong)__end._M_node >> 0x20);
  testing::internal::EqHelper<false>::Compare<char[3],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
             in_stack_fffffffffffffd40,
             (char (*) [3])CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38),
             in_stack_fffffffffffffd30);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)local_81);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_50);
  line = CONCAT13(bVar1,(int3)in_stack_fffffffffffffd4c);
  if (!bVar1) {
    testing::Message::Message((Message *)__beg._M_node);
    in_stack_fffffffffffffd40 =
         testing::AssertionResult::failure_message((AssertionResult *)0x1819de);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)__beg._M_node,type,(char *)pbVar2,line,in_stack_fffffffffffffd40);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffdb0.ptr_,in_stack_fffffffffffffda8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd30);
    testing::Message::~Message((Message *)0x181a3b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x181a93);
  std::__cxx11::stringstream::stringstream(local_220);
  std::ostream_iterator<char,_char,_std::char_traits<char>_>::ostream_iterator(&local_230,local_210)
  ;
  fmt::v5::format_to<std::ostream_iterator<char,char,std::char_traits<char>>,char[3],int>
            (in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  std::__cxx11::stringstream::str();
  testing::internal::EqHelper<false>::Compare<char[3],std::__cxx11::string>
            ((char *)CONCAT44(line,in_stack_fffffffffffffd48),in_stack_fffffffffffffd40,
             (char (*) [3])CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38),
             in_stack_fffffffffffffd30);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffd88);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffda8);
  if (!bVar1) {
    testing::Message::Message((Message *)__beg._M_node);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x181bd3)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)__beg._M_node,type,(char *)pbVar2,line,in_stack_fffffffffffffd40);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffdb0.ptr_,in_stack_fffffffffffffda8);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x181c21);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x181c70);
  std::__cxx11::stringstream::~stringstream(local_220);
  std::__cxx11::list<char,_std::allocator<char>_>::~list
            ((list<char,_std::allocator<char>_> *)0x181c8a);
  return;
}

Assistant:

TEST(FormatTest, OutputIterators) {
  std::list<char> out;
  fmt::format_to(std::back_inserter(out), "{}", 42);
  EXPECT_EQ("42", std::string(out.begin(), out.end()));
  std::stringstream s;
  fmt::format_to(std::ostream_iterator<char>(s), "{}", 42);
  EXPECT_EQ("42", s.str());
}